

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_model(V *values,int num_keys,LinearModel<int> *model,bool use_sampling)

{
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  longdouble lVar6;
  longdouble lVar7;
  undefined1 auVar8 [16];
  long lVar9;
  undefined1 auVar10 [16];
  LinearModelBuilder<int> builder;
  undefined1 local_78 [120];
  
  if ((int)CONCAT71(in_register_00000009,use_sampling) == 0) {
    local_78._48_10_ = (unkbyte10)0;
    local_78._80_4_ = 0x7fffffff;
    local_78._84_4_ = -0x80000000;
    local_78._32_10_ = local_78._48_10_;
    local_78._16_10_ = local_78._48_10_;
    local_78._64_10_ = local_78._48_10_;
    local_78._88_16_ = _DAT_00111160;
    if (num_keys < 1) {
      num_keys = 0;
    }
    else {
      uVar5 = 0;
      do {
        iVar1 = values[uVar5].first;
        lVar6 = (longdouble)iVar1;
        local_78._16_10_ = (longdouble)local_78._16_10_ + lVar6;
        lVar7 = (longdouble)(int)uVar5;
        local_78._32_10_ = (longdouble)local_78._32_10_ + lVar7;
        local_78._48_10_ = lVar6 * lVar6 + (longdouble)local_78._48_10_;
        local_78._64_10_ = lVar7 * lVar6 + (longdouble)local_78._64_10_;
        if (iVar1 <= (int)local_78._80_4_) {
          local_78._80_4_ = iVar1;
        }
        if (iVar1 < (int)local_78._84_4_) {
          iVar1 = local_78._84_4_;
        }
        local_78._84_4_ = iVar1;
        auVar8._0_8_ = (double)(int)uVar5;
        auVar8._8_8_ = auVar8._0_8_;
        auVar3 = vunpcklpd_avx(local_78._88_16_,auVar8);
        lVar9 = local_78._96_8_;
        auVar10._8_8_ = lVar9;
        auVar10._0_8_ = auVar8._0_8_;
        uVar4 = vcmppd_avx512vl(auVar3,auVar10,1);
        bVar2 = (bool)((byte)(uVar4 & 3) & 1);
        local_78._88_8_ = (ulong)bVar2 * local_78._88_8_ | (ulong)!bVar2 * (long)auVar8._0_8_;
        uVar4 = (uVar4 & 3) >> 1;
        local_78._96_8_ = uVar4 * lVar9 | (ulong)!SUB81(uVar4,0) * (long)auVar8._0_8_;
        uVar5 = uVar5 + 1;
      } while ((uint)num_keys != uVar5);
    }
    local_78._0_8_ = model;
    local_78._8_4_ = num_keys;
    LinearModelBuilder<int>::build((LinearModelBuilder<int> *)local_78);
    return;
  }
  build_model_sampling(values,num_keys,model,false);
  return;
}

Assistant:

static void build_model(const V* values, int num_keys, LinearModel<T>* model,
                          bool use_sampling = false) {
    if (use_sampling) {
      build_model_sampling(values, num_keys, model);
      return;
    }

    LinearModelBuilder<T> builder(model);
    for (int i = 0; i < num_keys; i++) {
      builder.add(values[i].first, i);
    }
    builder.build();
  }